

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_sqadd_u16_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (int)(short)b + (a & 0xffff);
  if ((int)uVar2 < 0x8000) {
    uVar2 = uVar2 & 0xffff;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar2 = 0x7fff;
  }
  iVar1 = ((int)b >> 0x10) + (a >> 0x10);
  if (0x7fff < iVar1) {
    (env->vfp).qc[0] = 1;
    iVar1 = 0x7fff;
  }
  return iVar1 << 0x10 | uVar2;
}

Assistant:

uint32_t HELPER(neon_sqadd_u16)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int32_t va, vb, vr;
    uint32_t r = 0;

    SSATACC(16, 0);
    SSATACC(16, 16);

    return r;
}